

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O3

parser_map *
argagg::validate_definitions
          (parser_map *__return_storage_ptr__,
          vector<argagg::definition,_std::allocator<argagg::definition>_> *definitions)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  *this;
  char cVar1;
  definition *pdVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  const_iterator cVar8;
  ostream *poVar9;
  runtime_error *prVar10;
  undefined8 *puVar11;
  int iVar12;
  char cVar13;
  pointer pdVar14;
  char *__s;
  pointer __k;
  ostringstream msg;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  long_map;
  string local_210 [32];
  pointer local_1f0;
  pointer local_1e8;
  undefined1 local_1e0 [32];
  pointer local_1c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  memset(__return_storage_ptr__,0,0x838);
  this = &__return_storage_ptr__->long_map;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&this->_M_h,&local_68);
  pdVar14 = (definitions->
            super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_1f0 = (definitions->
              super__Vector_base<argagg::definition,_std::allocator<argagg::definition>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (pdVar14 != local_1f0) {
    do {
      __k = (pdVar14->flags).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      local_1e8 = (pdVar14->flags).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1e8 == __k) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"option \"",8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1e0,(pdVar14->name)._M_dataplus._M_p,
                            (pdVar14->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" has no flag definitions",0x19)
        ;
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar10,local_210);
        *(undefined ***)prVar10 = &PTR__runtime_error_0015fba0;
        __cxa_throw(prVar10,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
      }
      do {
        pcVar7 = (__k->_M_dataplus)._M_p;
        sVar6 = strlen(pcVar7);
        uVar4 = local_1e0._0_8_;
        if ((sVar6 < 2) || (*pcVar7 != '-')) {
LAB_0013fd75:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1e0,"flag \"",6);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1e0,(__k->_M_dataplus)._M_p,__k->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"\" specified for option \"",0x18);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pdVar14->name)._M_dataplus._M_p,
                              (pdVar14->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" is invalid",0xc);
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar10,local_210);
          *(undefined ***)prVar10 = &PTR__runtime_error_0015fba0;
          __cxa_throw(prVar10,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
        }
        local_1e0._0_8_ = local_1e0._0_8_ & 0xffffffffffffff00;
        cVar1 = pcVar7[1];
        if (cVar1 == '-') {
          local_1e0._1_7_ = SUB87(uVar4,1);
          local_1e0[0] = 1;
          if (sVar6 == 2) goto LAB_0013fd75;
          __s = pcVar7 + 2;
          cVar13 = pcVar7[2];
        }
        else {
          __s = pcVar7 + 1;
          cVar13 = cVar1;
        }
        sVar6 = strlen(__s);
        iVar5 = isalnum((int)cVar13);
        if (((iVar5 == 0) || (cVar1 != '-' && 1 < sVar6)) ||
           (pcVar7 = std::
                     __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<argagg::is_valid_flag_definition(char_const*)::_lambda(char_const&)_1_>>
                               (__s + 1,__s + sVar6,(string *)local_1e0), pcVar7 != __s + sVar6))
        goto LAB_0013fd75;
        pcVar7 = (__k->_M_dataplus)._M_p;
        if (*pcVar7 == '-') {
          iVar12 = (int)pcVar7[1];
          iVar5 = isalnum(iVar12);
          if (iVar5 == 0) goto LAB_0013fcd8;
          pdVar2 = (__return_storage_ptr__->short_map)._M_elems[iVar12];
          if (pdVar2 != (definition *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,"duplicate short flag \"",0x16);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(__k->_M_dataplus)._M_p,__k->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"\" found, specified by both option  \"",0x24);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(pdVar14->name)._M_dataplus._M_p,
                                (pdVar14->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" and option \"",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,(pdVar2->name)._M_dataplus._M_p,(pdVar2->name)._M_string_length);
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar10,local_210);
            *(undefined ***)prVar10 = &PTR__runtime_error_0015fba0;
            __cxa_throw(prVar10,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
          }
          (__return_storage_ptr__->short_map)._M_elems[iVar12] = pdVar14;
        }
        else {
LAB_0013fcd8:
          cVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&this->_M_h,__k);
          if (cVar8.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
              ._M_cur != (__node_type *)0x0) {
            cVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(&this->_M_h,__k);
            if (cVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
                ._M_cur == (__node_type *)0x0) {
              puVar11 = (undefined8 *)0x0;
            }
            else {
              puVar11 = *(undefined8 **)
                         ((long)cVar8.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_true>
                                ._M_cur + 0x28);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1e0,"duplicate long flag \"",0x15);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1e0,(__k->_M_dataplus)._M_p,__k->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,"\" found, specified by both option  \"",0x24);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(pdVar14->name)._M_dataplus._M_p,
                                (pdVar14->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" and option \"",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)*puVar11,puVar11[1]);
            prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar10,local_210);
            *(undefined ***)prVar10 = &PTR__runtime_error_0015fba0;
            __cxa_throw(prVar10,&invalid_flag::typeinfo,std::runtime_error::~runtime_error);
          }
          local_1e0._0_8_ = local_1e0 + 0x10;
          pcVar3 = (__k->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1e0,pcVar3,pcVar3 + __k->_M_string_length);
          local_1c0 = pdVar14;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,argagg::definition_const*>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,argagg::definition_const*>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this,(string *)local_1e0);
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_);
          }
        }
        __k = __k + 1;
      } while (__k != local_1e8);
      pdVar14 = pdVar14 + 1;
    } while (pdVar14 != local_1f0);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

inline
parser_map validate_definitions(
  const std::vector<definition>& definitions)
{
  std::unordered_map<std::string, const definition*> long_map;
  parser_map map {{{nullptr}}, std::move(long_map)};

  for (auto& defn : definitions) {

    if (defn.flags.size() == 0) {
      std::ostringstream msg;
      msg << "option \"" << defn.name << "\" has no flag definitions";
      throw invalid_flag(msg.str());
    }

    for (auto& flag : defn.flags) {

      if (!is_valid_flag_definition(flag.data())) {
        std::ostringstream msg;
        msg << "flag \"" << flag << "\" specified for option \"" << defn.name
            << "\" is invalid";
        throw invalid_flag(msg.str());
      }

      if (flag_is_short(flag.data())) {
        const std::size_t short_flag_letter = static_cast<std::size_t>(flag[1]);
        const auto existing_short_flag =
          map.short_map[short_flag_letter];
        bool short_flag_already_exists = (existing_short_flag != nullptr);
        if (short_flag_already_exists) {
          std::ostringstream msg;
          msg << "duplicate short flag \"" << flag
              << "\" found, specified by both option  \"" << defn.name
              << "\" and option \"" << existing_short_flag->name;
          throw invalid_flag(msg.str());
        }
        map.short_map[static_cast<std::size_t>(short_flag_letter)] = &defn;
        continue;
      }

      // If we're here then this is a valid, long-style flag.
      if (map.known_long_flag(flag)) {
        const auto existing_long_flag = map.get_definition_for_long_flag(flag);
        std::ostringstream msg;
        msg << "duplicate long flag \"" << flag
            << "\" found, specified by both option  \"" << defn.name
            << "\" and option \"" << existing_long_flag->name;
        throw invalid_flag(msg.str());
      }
      map.long_map.insert(std::make_pair(flag, &defn));
    }
  }

  return map;
}